

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

fdb_status convert_errno_to_fdb_status(int errno_value,fdb_status default_status)

{
  fdb_status fVar1;
  
  switch(errno_value) {
  case 1:
    fVar1 = FDB_RESULT_EPERM;
    break;
  case 2:
    fVar1 = FDB_RESULT_NO_SUCH_FILE;
    break;
  case 3:
  case 4:
  case 7:
  case 8:
  case 10:
  case 0xf:
  case 0x10:
  case 0x12:
  case 0x19:
  case 0x1a:
  case 0x1d:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x25:
  case 0x26:
  case 0x27:
    return default_status;
  case 5:
    fVar1 = FDB_RESULT_EIO;
    break;
  case 6:
    fVar1 = FDB_RESULT_ENXIO;
    break;
  case 9:
    fVar1 = FDB_RESULT_EBADF;
    break;
  case 0xb:
    return FDB_RESULT_EAGAIN;
  case 0xc:
    fVar1 = FDB_RESULT_ENOMEM;
    break;
  case 0xd:
    fVar1 = FDB_RESULT_EACCESS;
    break;
  case 0xe:
    fVar1 = FDB_RESULT_EFAULT;
    break;
  case 0x11:
    fVar1 = FDB_RESULT_EEXIST;
    break;
  case 0x13:
    fVar1 = FDB_RESULT_ENODEV;
    break;
  case 0x14:
    fVar1 = FDB_RESULT_ENOTDIR;
    break;
  case 0x15:
    fVar1 = FDB_RESULT_EISDIR;
    break;
  case 0x16:
    fVar1 = FDB_RESULT_EINVAL;
    break;
  case 0x17:
    fVar1 = FDB_RESULT_ENFILE;
    break;
  case 0x18:
    fVar1 = FDB_RESULT_EMFILE;
    break;
  case 0x1b:
    fVar1 = FDB_RESULT_EFBIG;
    break;
  case 0x1c:
    fVar1 = FDB_RESULT_ENOSPC;
    break;
  case 0x1e:
    fVar1 = FDB_RESULT_EROFS;
    break;
  case 0x24:
    fVar1 = FDB_RESULT_ENAMETOOLONG;
    break;
  case 0x28:
    fVar1 = FDB_RESULT_ELOOP;
    break;
  default:
    if (errno_value == 0x4b) {
      fVar1 = FDB_RESULT_EOVERFLOW;
    }
    else if (errno_value == 0x5f) {
      fVar1 = FDB_RESULT_EOPNOTSUPP;
    }
    else {
      if (errno_value != 0x69) {
        return default_status;
      }
      fVar1 = FDB_RESULT_ENOBUFS;
    }
  }
  return fVar1;
}

Assistant:

fdb_status convert_errno_to_fdb_status(int errno_value,
                                       fdb_status default_status)
{
    switch (errno_value) {
    case EACCES:
        return FDB_RESULT_EACCESS;
    case EEXIST:
        return FDB_RESULT_EEXIST;
    case EFAULT:
        return FDB_RESULT_EFAULT;
    case EFBIG:
        return FDB_RESULT_EFBIG;
    case EINVAL:
        return FDB_RESULT_EINVAL;
    case EISDIR:
        return FDB_RESULT_EISDIR;
    case ELOOP:
        return FDB_RESULT_ELOOP;
    case EMFILE:
        return FDB_RESULT_EMFILE;
    case ENAMETOOLONG:
        return FDB_RESULT_ENAMETOOLONG;
    case ENFILE:
        return FDB_RESULT_ENFILE;
    case ENODEV:
        return FDB_RESULT_ENODEV;
    case ENOENT:
        return FDB_RESULT_NO_SUCH_FILE;
    case ENOMEM:
        return FDB_RESULT_ENOMEM;
    case ENOSPC:
        return FDB_RESULT_ENOSPC;
    case ENOTDIR:
        return FDB_RESULT_ENOTDIR;
    case ENXIO:
        return FDB_RESULT_ENXIO;
    case EOPNOTSUPP:
        return FDB_RESULT_EOPNOTSUPP;
    case EOVERFLOW:
        return FDB_RESULT_EOVERFLOW;
    case EPERM:
        return FDB_RESULT_EPERM;
    case EROFS:
        return FDB_RESULT_EROFS;
    case EBADF:
        return FDB_RESULT_EBADF;
    case EIO:
        return FDB_RESULT_EIO;
    case ENOBUFS:
        return FDB_RESULT_ENOBUFS;
    case EAGAIN:
        return FDB_RESULT_EAGAIN;

    default:
        return default_status;
    }
}